

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmcS.c
# Opt level: O2

int Gia_ManCountTents(Gia_Man_t *p)

{
  int iVar1;
  int iVar2;
  int iObj;
  Vec_Int_t *p_00;
  Gia_Obj_t *pObj;
  int iVar3;
  
  if (p->vCos->nSize <= p->nRegs) {
    __assert_fail("Gia_ManPoNum(p) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcBmcS.c"
                  ,0x113,"int Gia_ManCountTents(Gia_Man_t *)");
  }
  Gia_ManIncrementTravId(p);
  Gia_ObjSetTravIdCurrentId(p,0);
  p_00 = Vec_IntAlloc(100);
  for (iVar3 = 0; iVar3 < p->vCos->nSize - p->nRegs; iVar3 = iVar3 + 1) {
    pObj = Gia_ManCo(p,iVar3);
    if (pObj == (Gia_Obj_t *)0x0) break;
    iVar2 = Gia_ObjFaninId0p(p,pObj);
    Vec_IntPush(p_00,iVar2);
  }
  iVar2 = 0;
  iVar3 = 0;
  while (iVar1 = p_00->nSize, iVar3 < iVar1) {
    for (; iVar3 < iVar1; iVar3 = iVar3 + 1) {
      iObj = Vec_IntEntry(p_00,iVar3);
      Gia_ManCountTents_rec(p,iObj,p_00);
    }
    iVar2 = iVar2 + 1;
    iVar3 = iVar1;
  }
  Vec_IntFree(p_00);
  return iVar2;
}

Assistant:

int Gia_ManCountTents( Gia_Man_t * p )
{
    Vec_Int_t * vRoots;
    Gia_Obj_t * pObj;  
    int t, i, iObj, nSizeCurr = 0;
    assert( Gia_ManPoNum(p) > 0 );
    Gia_ManIncrementTravId( p );
    Gia_ObjSetTravIdCurrentId( p, 0 );
    vRoots = Vec_IntAlloc( 100 );
    Gia_ManForEachPo( p, pObj, i )
        Vec_IntPush( vRoots, Gia_ObjFaninId0p(p, pObj) );
    for ( t = 0; nSizeCurr < Vec_IntSize(vRoots); t++ )
    {
        int nSizePrev = nSizeCurr;
        nSizeCurr = Vec_IntSize(vRoots);
        Vec_IntForEachEntryStartStop( vRoots, iObj, i, nSizePrev, nSizeCurr )
            Gia_ManCountTents_rec( p, iObj, vRoots );
    }
    Vec_IntFree( vRoots );
    return t;
}